

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

bool __thiscall Network::Address::Ethernet::asText(Ethernet *this,String *textualValue)

{
  uint uVar1;
  int64 iVar2;
  String local_a8;
  int local_94;
  ulong uStack_90;
  int consumed;
  size_t i;
  String local_80;
  String local_70 [2];
  String local_50;
  String local_40;
  undefined1 local_30 [8];
  String rawBytes;
  String *textualValue_local;
  Ethernet *this_local;
  
  rawBytes.super_tagbstring.data = (uchar *)textualValue;
  Bstrlib::String::String(&local_50," \t\v\f\r\n",7);
  Bstrlib::String::Trimmed(&local_40,textualValue);
  Bstrlib::String::String(local_70,":");
  Bstrlib::String::String(&local_80,"");
  Bstrlib::String::replacedAll((String *)local_30,&local_40,local_70);
  Bstrlib::String::~String(&local_80);
  Bstrlib::String::~String(local_70);
  Bstrlib::String::~String(&local_40);
  Bstrlib::String::~String(&local_50);
  uVar1 = Bstrlib::String::getLength((String *)local_30);
  if (uVar1 < 0xc) {
    this_local._7_1_ = false;
  }
  else {
    for (uStack_90 = 0; uStack_90 < 6; uStack_90 = uStack_90 + 1) {
      local_94 = 0;
      Bstrlib::String::splitAt(&local_a8,(int)local_30);
      iVar2 = Bstrlib::String::parseInt(&local_a8,0x10,&local_94);
      this->address[uStack_90] = (uint8)iVar2;
      Bstrlib::String::~String(&local_a8);
      if (local_94 < 2) {
        this_local._7_1_ = false;
        goto LAB_00117d36;
      }
    }
    this_local._7_1_ = true;
  }
LAB_00117d36:
  i._4_4_ = 1;
  Bstrlib::String::~String((String *)local_30);
  return this_local._7_1_;
}

Assistant:

bool Ethernet::asText(const String & textualValue)
        {
            String rawBytes = textualValue.Trimmed().replacedAll(":", "");
            if ((size_t)rawBytes.getLength() < ArrSz(address) * 2) return false;
            for (size_t i = 0; i < ArrSz(address); i++)
            {
                int consumed = 0;
                address[i] = (uint8)rawBytes.splitAt(2).parseInt(16, &consumed);
                if (consumed < 2) return false;
            }
            return true;
        }